

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

la_proto_node * la_miam_core_v1_data_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen)

{
  int iVar1;
  uint32_t uVar2;
  long *plVar3;
  la_proto_node *plVar4;
  void *pvVar5;
  byte *pbVar6;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  size_t in_RDI;
  size_t unaff_retaddr;
  uint32_t crc_check;
  uint8_t *pdu_data;
  la_inflate_result inflated;
  uint8_t app_id_len;
  uint8_t bytes_needed;
  la_proto_node *node;
  la_miam_core_v1_data_pdu *pdu;
  long local_50;
  long local_48;
  byte local_40;
  byte local_32;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  plVar3 = (long *)la_xcalloc(unaff_retaddr,in_RDI,
                              (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                              (int)((ulong)in_RDX >> 0x20),
                              (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  plVar4 = la_proto_node_new();
  plVar4->td = &la_DEF_miam_core_v1_data_pdu;
  plVar4->data = plVar3;
  plVar4->next = (la_proto_node *)0x0;
  if (in_ESI < 0x14) {
    *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 8;
  }
  else {
    *(uint *)(plVar3 + 1) =
         (uint)*(byte *)(in_RDI + 1) << 0x10 | (uint)*(byte *)(in_RDI + 2) << 8 |
         (uint)*(byte *)(in_RDI + 3);
    if ((uint)(in_ESI + in_ECX) < *(uint *)(plVar3 + 1)) {
      *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 0x10000;
    }
    *(undefined4 *)(plVar3 + 3) = *(undefined4 *)(in_RDI + 4);
    *(undefined2 *)((long)plVar3 + 0x1c) = *(undefined2 *)(in_RDI + 8);
    *(undefined1 *)((long)plVar3 + 0x1e) = *(undefined1 *)(in_RDI + 10);
    *(undefined1 *)((long)plVar3 + 0x1f) = 0;
    *(char *)((long)plVar3 + 0x27) = (char)((int)(uint)*(byte *)(in_RDI + 0xb) >> 1);
    *(byte *)(plVar3 + 5) = *(byte *)(in_RDI + 0xb) & 1;
    *(byte *)((long)plVar3 + 0x29) =
         (*(byte *)(in_RDI + 0xc) & 1) << 2 | (byte)((int)(uint)*(byte *)(in_RDI + 0xd) >> 6);
    *(byte *)((long)plVar3 + 0x2a) = (byte)((int)(uint)*(byte *)(in_RDI + 0xd) >> 4) & 3;
    *(byte *)((long)plVar3 + 0x2b) = *(byte *)(in_RDI + 0xd) & 0xf;
    pvVar5 = (void *)(in_RDI + 0xe);
    iVar1 = in_ESI + -0xe;
    if (*(char *)((long)plVar3 + 0x2b) == '\0') {
      local_32 = 2;
    }
    else if (*(char *)((long)plVar3 + 0x2b) == '\x01') {
      local_32 = 4;
    }
    else {
      if ((*(char *)((long)plVar3 + 0x2b) != '\x02') && (*(char *)((long)plVar3 + 0x2b) != '\x03'))
      {
        *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 0x10;
        return plVar4;
      }
      local_32 = 6;
    }
    if (iVar1 < (int)(uint)(byte)(local_32 + 4)) {
      *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 8;
    }
    else {
      memcpy(plVar3 + 4,pvVar5,(ulong)local_32);
      *(undefined1 *)((long)plVar3 + 0x26) = 0;
      pbVar6 = (byte *)((long)pvVar5 + (long)(int)(uint)local_32);
      *(uint *)((long)plVar3 + 0x14) =
           (uint)*pbVar6 << 0x18 | (uint)pbVar6[1] << 0x10 | (uint)pbVar6[2] << 8 | (uint)pbVar6[3];
      if ((in_RDX != (void *)0x0) && (0 < in_ECX)) {
        if (*(char *)((long)plVar3 + 0x29) == '\x01') {
          la_inflate((uint8_t *)pdu,node._4_4_);
          *(undefined1 *)(local_50 + local_48) = 0;
          *plVar3 = local_50;
          *(int *)((long)plVar3 + 0xc) = (int)local_48;
          if ((local_40 & 1) == 0) {
            *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 0x20000;
          }
        }
        else if (*(char *)((long)plVar3 + 0x29) == '\0') {
          pvVar5 = la_xcalloc(unaff_retaddr,(size_t)(pbVar6 + 4),
                              (char *)CONCAT44((iVar1 - (uint)local_32) + -4,
                                               in_stack_fffffffffffffff0),
                              (int)((ulong)in_RDX >> 0x20),
                              (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
          memcpy(pvVar5,in_RDX,(long)in_ECX);
          *(undefined1 *)((long)pvVar5 + (long)in_ECX) = 0;
          *plVar3 = (long)pvVar5;
          *(int *)((long)plVar3 + 0xc) = in_ECX;
        }
        else {
          *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 0x40000;
        }
        uVar2 = la_crc32_arinc665((uint8_t *)*plVar3,*(uint32_t *)((long)plVar3 + 0xc),0xffffffff);
        if ((uVar2 ^ 0xffffffff) != *(uint *)((long)plVar3 + 0x14)) {
          *(uint *)(plVar3 + 2) = *(uint *)(plVar3 + 2) | 0x80000;
        }
      }
    }
  }
  return plVar4;
}

Assistant:

static la_proto_node *la_miam_core_v1_data_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf, int bodylen) {
	la_assert(hdrbuf != NULL);

	LA_NEW(la_miam_core_v1_data_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_v1_data_pdu;
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 20) {
		la_debug_print(D_ERROR, "Header too short: %d < 20\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	if(pdu->pdu_len > (uint32_t)(hdrlen + bodylen)) {
		la_debug_print(D_ERROR, "PDU truncated: length from header: %d > pdu_len %d (%d+%d)\n",
				pdu->pdu_len, hdrlen + bodylen, hdrlen, bodylen);
		pdu->err |= LA_MIAM_ERR_BODY_TRUNCATED;
	}
	hdrbuf += 4; hdrlen -= 4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	uint8_t bytes_needed = 0;
	pdu->msg_num = (hdrbuf[0] >> 1) & 0x7f;
	pdu->ack_option = hdrbuf[0] & 0x1;
	la_debug_print(D_INFO, "msg_num: %u ack_option: %u\n", pdu->msg_num, pdu->ack_option);
	hdrbuf++; hdrlen--;

	pdu->compression = ((hdrbuf[0] << 2) | ((hdrbuf[1] >> 6) & 0x3)) & 0x7;
	pdu->encoding = (hdrbuf[1] >> 4) & 0x3;
	pdu->app_type = hdrbuf[1] & 0xf;
	la_debug_print(D_INFO, "compression: 0x%x encoding: 0x%x app_type: 0x%x\n",
			pdu->compression, pdu->encoding, pdu->app_type);
	hdrbuf += 2; hdrlen -= 2;

	uint8_t app_id_len = 0;
	if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_2CHAR) {
		app_id_len = 2;
	} else if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR) {
		app_id_len = 4;
	} else if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR ||
			pdu->app_type == LA_MIAM_CORE_V1_APP_NONACARS_6CHAR) {
		app_id_len = 6;
	} else {
		la_debug_print(D_ERROR, "Unknown app type 0x%u\n", pdu->app_type);
		pdu->err |= LA_MIAM_ERR_HDR_APP_TYPE_UNKNOWN;
		goto end;
	}
	bytes_needed = app_id_len + LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen < bytes_needed) {
		la_debug_print(D_ERROR, "Header too short for app_type 0x%x: "
				"need %u more bytes but only %u available\n",
				pdu->app_type, bytes_needed, hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}
	memcpy(pdu->app_id, hdrbuf, app_id_len);
	pdu->app_id[6] = '\0';
	la_debug_print(D_INFO, "app_id: '%s'\n", pdu->app_id);
	hdrbuf += app_id_len; hdrlen -= app_id_len;

	pdu->crc = (hdrbuf[0] << 24) | (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += LA_MIAM_CORE_V1_CRC_LEN; hdrlen -= LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen > 0) {
		la_debug_print(D_ERROR, "Warning: %u bytes left after MIAM header\n", hdrlen);
	}
	if(bodybuf != NULL && bodylen > 0) {
#ifdef WITH_ZLIB
		if(pdu->compression == LA_MIAM_CORE_V1_COMP_DEFLATE) {
			la_inflate_result inflated = la_inflate(bodybuf, bodylen);
			la_debug_print_buf_hex(D_VERBOSE, inflated.buf, (int)inflated.buflen,
					"Decompressed content:\n");
			// If it's text, it needs a NULL terminator.
			// If it's not text, it doesn't hurt either. The buffer is larger than len anyway.
			inflated.buf[inflated.buflen] = '\0';
			pdu->data = inflated.buf;
			pdu->data_len = inflated.buflen;
			if(inflated.success == false) {
				pdu->err |= LA_MIAM_ERR_BODY_INFLATE_FAILED;
			}
		} else
#endif
			if(pdu->compression == LA_MIAM_CORE_V1_COMP_NONE) {
				uint8_t *pdu_data = LA_XCALLOC(bodylen + 1, sizeof(uint8_t));
				memcpy(pdu_data, bodybuf, bodylen);
				pdu_data[bodylen] = '\0';
				pdu->data = pdu_data;
				pdu->data_len = bodylen;
			} else {
				pdu->err |= LA_MIAM_ERR_BODY_COMPR_UNSUPPORTED;
			}
		uint32_t crc_check = la_crc32_arinc665(pdu->data, pdu->data_len, 0xFFFFFFFFu);
		crc_check = ~crc_check;
		la_debug_print(D_INFO, "crc: %08x crc_check: %08x\n", pdu->crc, crc_check);
		if(crc_check != pdu->crc) {
			pdu->err |= LA_MIAM_ERR_BODY_CRC_FAILED;
		}
	}
end:
	return node;
}